

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>
wabt::MakeUnique<wabt::StructType,std::__cxx11::string&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  pointer pcVar1;
  string_view local_28;
  
  pcVar1 = (pointer)operator_new(0x68);
  local_28.data_ = (char *)0x0;
  local_28.size_ = 0;
  *(undefined ***)pcVar1 = &PTR__TypeEntry_001bd518;
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  pcVar1[0x10] = '\0';
  pcVar1[0x11] = '\0';
  pcVar1[0x12] = '\0';
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  pcVar1[0x18] = '\0';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  pcVar1[0x20] = '\0';
  pcVar1[0x21] = '\0';
  pcVar1[0x22] = '\0';
  pcVar1[0x23] = '\0';
  string_view::to_string_abi_cxx11_((string *)(pcVar1 + 0x28),&local_28);
  pcVar1[0x48] = '\x01';
  pcVar1[0x49] = '\0';
  pcVar1[0x4a] = '\0';
  pcVar1[0x4b] = '\0';
  *(undefined ***)pcVar1 = &PTR__StructType_001bdcf0;
  pcVar1[0x50] = '\0';
  pcVar1[0x51] = '\0';
  pcVar1[0x52] = '\0';
  pcVar1[0x53] = '\0';
  pcVar1[0x54] = '\0';
  pcVar1[0x55] = '\0';
  pcVar1[0x56] = '\0';
  pcVar1[0x57] = '\0';
  pcVar1[0x58] = '\0';
  pcVar1[0x59] = '\0';
  pcVar1[0x5a] = '\0';
  pcVar1[0x5b] = '\0';
  pcVar1[0x5c] = '\0';
  pcVar1[0x5d] = '\0';
  pcVar1[0x5e] = '\0';
  pcVar1[0x5f] = '\0';
  pcVar1[0x60] = '\0';
  pcVar1[0x61] = '\0';
  pcVar1[0x62] = '\0';
  pcVar1[99] = '\0';
  pcVar1[100] = '\0';
  pcVar1[0x65] = '\0';
  pcVar1[0x66] = '\0';
  pcVar1[0x67] = '\0';
  (args->_M_dataplus)._M_p = pcVar1;
  return (__uniq_ptr_data<wabt::StructType,_std::default_delete<wabt::StructType>,_true,_true>)
         (__uniq_ptr_data<wabt::StructType,_std::default_delete<wabt::StructType>,_true,_true>)args;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}